

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O3

void __thiscall itis::AVLTree<long_long>::insert(AVLTree<long_long> *this,longlong value)

{
  AVLTreeNode<long_long> *this_00;
  AVLTreeNode<long_long> **indirect;
  vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_> path;
  AVLTreeNode<long_long> **local_60;
  vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_> local_58
  ;
  vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_> local_38
  ;
  
  local_60 = &this->root;
  local_58.
  super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
  ._M_impl.super__Vector_impl_data._M_finish = (AVLTreeNode<long_long> ***)0x0;
  local_58.
  super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (AVLTreeNode<long_long> ***)0x0;
  if (this->root != (AVLTreeNode<long_long> *)0x0) {
    do {
      if (local_58.
          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_58.
          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<itis::AVLTreeNode<long_long>**,std::allocator<itis::AVLTreeNode<long_long>**>>::
        _M_realloc_insert<itis::AVLTreeNode<long_long>**const&>
                  ((vector<itis::AVLTreeNode<long_long>**,std::allocator<itis::AVLTreeNode<long_long>**>>
                    *)&local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_60);
      }
      else {
        *local_58.
         super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_60;
        local_58.
        super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_60 = &(*local_60)->right + (value < (*local_60)->value);
    } while (*local_60 != (AVLTreeNode<long_long> *)0x0);
  }
  this_00 = (AVLTreeNode<long_long> *)operator_new(0x20);
  AVLTreeNode<long_long>::AVLTreeNode(this_00,value);
  *local_60 = this_00;
  if (local_58.
      super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.
      super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<itis::AVLTreeNode<long_long>**,std::allocator<itis::AVLTreeNode<long_long>**>>::
    _M_realloc_insert<itis::AVLTreeNode<long_long>**const&>
              ((vector<itis::AVLTreeNode<long_long>**,std::allocator<itis::AVLTreeNode<long_long>**>>
                *)&local_58,
               (iterator)
               local_58.
               super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_60);
  }
  else {
    *local_58.
     super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
     ._M_impl.super__Vector_impl_data._M_finish = local_60;
    local_58.
    super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  std::vector<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>::
  vector(&local_38,&local_58);
  balance(this,&local_38);
  if (local_38.
      super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  this->_size = this->_size + 1;
  if (local_58.
      super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<itis::AVLTreeNode<long_long>_**,_std::allocator<itis::AVLTreeNode<long_long>_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AVLTree<T>::insert(T value) {
    AVLTreeNode<T> **indirect = &root;    // to generalize insertion
    std::vector<AVLTreeNode<T> **> path;  // to update height values

    while (*indirect != nullptr) {
      path.push_back(indirect);

      if ((*indirect)->value > value) {
        indirect = &((*indirect)->left);
      } else {
        indirect = &((*indirect)->right);
      }
    }

    *indirect = new AVLTreeNode<T>(value);
    path.push_back(indirect);

    balance(path);
    _size++;
  }